

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

RecyclableObject *
Js::JavascriptOperators::SpeciesConstructor
          (RecyclableObject *object,JavascriptFunction *defaultConstructor,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  RecyclableObject *pRVar6;
  Var local_38;
  Var species;
  
  BVar3 = IsObject(object);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2995,"(JavascriptOperators::IsObject(object))",
                                "JavascriptOperators::IsObject(object)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = GetProperty(object,object,0x67,scriptContext,(PropertyValueInfo *)0x0);
  BVar3 = IsUndefinedObject(pvVar5);
  if (BVar3 == 0) {
    BVar3 = IsObject(pvVar5);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,L"[constructor]");
    }
    local_38 = (Var)0x0;
    pRVar6 = VarTo<Js::RecyclableObject>(pvVar5);
    BVar3 = GetProperty_Internal<false>
                      (pRVar6,pRVar6,false,0x19,&local_38,scriptContext,(PropertyValueInfo *)0x0);
    if ((BVar3 != 0) && (BVar3 = IsUndefinedOrNull(local_38), pvVar5 = local_38, BVar3 == 0)) {
      bVar2 = VarIs<Js::RecyclableObject>(local_38);
      if (bVar2) {
        pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
      }
      else {
        pRVar6 = (RecyclableObject *)0x0;
      }
      if ((pRVar6 != (RecyclableObject *)0x0) && (bVar2 = IsConstructor(pRVar6), bVar2)) {
        return pRVar6;
      }
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec00,L"constructor[Symbol.species]");
    }
  }
  return (RecyclableObject *)defaultConstructor;
}

Assistant:

RecyclableObject* JavascriptOperators::SpeciesConstructor(_In_ RecyclableObject* object, _In_ JavascriptFunction* defaultConstructor, _In_ ScriptContext* scriptContext)
    {
        //1.Assert: Type(O) is Object.
        Assert(JavascriptOperators::IsObject(object));

        //2.Let C be Get(O, "constructor").
        //3.ReturnIfAbrupt(C).
        Var constructor = JavascriptOperators::GetProperty(object, PropertyIds::constructor, scriptContext);

        //4.If C is undefined, return defaultConstructor.
        if (JavascriptOperators::IsUndefinedObject(constructor))
        {
            return defaultConstructor;
        }
        //5.If Type(C) is not Object, throw a TypeError exception.
        if (!JavascriptOperators::IsObject(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("[constructor]"));
        }
        //6.Let S be Get(C, @@species).
        //7.ReturnIfAbrupt(S).
        Var species = nullptr;
        if (!JavascriptOperators::GetProperty(VarTo<RecyclableObject>(constructor),
            PropertyIds::_symbolSpecies, &species, scriptContext)
            || JavascriptOperators::IsUndefinedOrNull(species))
        {
            //8.If S is either undefined or null, return defaultConstructor.
            return defaultConstructor;
        }
        constructor = species;

        //9.If IsConstructor(S) is true, return S.
        RecyclableObject* constructorObj = JavascriptOperators::TryFromVar<RecyclableObject>(constructor);
        if (constructorObj && JavascriptOperators::IsConstructor(constructorObj))
        {
            return constructorObj;
        }
        //10.Throw a TypeError exception.
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor, _u("constructor[Symbol.species]"));
    }